

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.hpp
# Opt level: O0

void __thiscall
ableton::platforms::asio::Socket<512ul>::
receive<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>::SocketReceiver<ableton::discovery::UnicastTag,ableton::util::SafeAsyncHandler<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>,ableton::link::PeerState,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>::Impl>>>
          (Socket<512ul> *this,
          SocketReceiver<ableton::discovery::UnicastTag,_ableton::util::SafeAsyncHandler<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl>_>
          *handler)

{
  element_type *peVar1;
  element_type *peVar2;
  SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> local_38;
  mutable_buffer local_28;
  SocketReceiver<ableton::discovery::UnicastTag,_ableton::util::SafeAsyncHandler<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl>_>
  *local_18;
  SocketReceiver<ableton::discovery::UnicastTag,_ableton::util::SafeAsyncHandler<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl>_>
  *handler_local;
  Socket<512UL> *this_local;
  
  local_18 = handler;
  handler_local =
       (SocketReceiver<ableton::discovery::UnicastTag,_ableton::util::SafeAsyncHandler<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl>_>
        *)this;
  peVar1 = std::
           __shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::
  function<void(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_char_const*,unsigned_char_const*)>
  ::operator=((function<void(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_char_const*,unsigned_char_const*)>
               *)&peVar1->mHandler,handler);
  peVar1 = std::
           __shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar2 = std::
           __shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  local_28 = (mutable_buffer)::asio::buffer<unsigned_char,512ul>(&peVar2->mReceiveBuffer,0x200);
  peVar2 = std::
           __shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  ableton::util::makeAsyncSafe<ableton::platforms::asio::Socket<512ul>::Impl>
            ((util *)&local_38,(shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl> *)this);
  ::asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  async_receive_from<asio::mutable_buffers_1,ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512ul>::Impl>>
            ((basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> *)
             peVar1,(mutable_buffers_1 *)&local_28,&peVar2->mSenderEndpoint,&local_38);
  ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>::~SafeAsyncHandler
            (&local_38);
  return;
}

Assistant:

void receive(Handler handler)
  {
    mpImpl->mHandler = std::move(handler);
    mpImpl->mSocket.async_receive_from(
      ::asio::buffer(mpImpl->mReceiveBuffer, MaxPacketSize), mpImpl->mSenderEndpoint,
      util::makeAsyncSafe(mpImpl));
  }